

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

void TestConstExpr::ConstCastTestT<signed_char>(void)

{
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  int iVar2;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffff0;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffff1;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffff2;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffff3;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffff4;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffff5;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffff6;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffff7;
  SafeInt local_1;
  
  if (ConstCastTestT<signed_char>()::b == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::b);
    if (iVar2 != 0) {
      local_1 = (SafeInt)ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::b = ::SafeInt::operator_cast_to_bool(&local_1);
      __cxa_guard_release(&ConstCastTestT<signed_char>()::b);
    }
  }
  if (ConstCastTestT<signed_char>()::w == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::w);
    if (iVar2 != 0) {
      ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::w =
           ::SafeInt::operator_cast_to_wchar_t
                     ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT17(in_stack_fffffffffffffff7.m_int,
                               CONCAT16(in_stack_fffffffffffffff6.m_int,
                                        CONCAT15(in_stack_fffffffffffffff5.m_int,
                                                 CONCAT14(in_stack_fffffffffffffff4.m_int,
                                                          CONCAT13(in_stack_fffffffffffffff3.m_int,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffff2.m_int,
                                                  CONCAT11(in_stack_fffffffffffffff1.m_int,
                                                           in_stack_fffffffffffffff0.m_int))))))));
      __cxa_guard_release(&ConstCastTestT<signed_char>()::w);
    }
  }
  if (ConstCastTestT<signed_char>()::c == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::c);
    if (iVar2 != 0) {
      ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::c =
           ::SafeInt::operator_cast_to_char
                     ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT17(in_stack_fffffffffffffff7.m_int,
                               CONCAT16(in_stack_fffffffffffffff6.m_int,
                                        CONCAT15(in_stack_fffffffffffffff5.m_int,
                                                 CONCAT14(in_stack_fffffffffffffff4.m_int,
                                                          CONCAT13(in_stack_fffffffffffffff3.m_int,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffff2.m_int,
                                                  CONCAT11(in_stack_fffffffffffffff1.m_int,
                                                           in_stack_fffffffffffffff0.m_int))))))));
      __cxa_guard_release(&ConstCastTestT<signed_char>()::c);
    }
  }
  if (ConstCastTestT<signed_char>()::sc == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::sc);
    if (iVar2 != 0) {
      ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::sc =
           ::SafeInt::operator_cast_to_signed_char
                     ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT17(in_stack_fffffffffffffff7.m_int,
                               CONCAT16(in_stack_fffffffffffffff6.m_int,
                                        CONCAT15(in_stack_fffffffffffffff5.m_int,
                                                 CONCAT14(in_stack_fffffffffffffff4.m_int,
                                                          CONCAT13(in_stack_fffffffffffffff3.m_int,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffff2.m_int,
                                                  CONCAT11(in_stack_fffffffffffffff1.m_int,
                                                           in_stack_fffffffffffffff0.m_int))))))));
      __cxa_guard_release(&ConstCastTestT<signed_char>()::sc);
    }
  }
  if (ConstCastTestT<signed_char>()::uc == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::uc);
    if (iVar2 != 0) {
      ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::uc =
           ::SafeInt::operator_cast_to_unsigned_char
                     ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT17(in_stack_fffffffffffffff7.m_int,
                               CONCAT16(in_stack_fffffffffffffff6.m_int,
                                        CONCAT15(in_stack_fffffffffffffff5.m_int,
                                                 CONCAT14(in_stack_fffffffffffffff4.m_int,
                                                          CONCAT13(in_stack_fffffffffffffff3.m_int,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffff2.m_int,
                                                  CONCAT11(in_stack_fffffffffffffff1.m_int,
                                                           in_stack_fffffffffffffff0.m_int))))))));
      __cxa_guard_release(&ConstCastTestT<signed_char>()::uc);
    }
  }
  if (ConstCastTestT<signed_char>()::s == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::s);
    if (iVar2 != 0) {
      ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::s =
           ::SafeInt::operator_cast_to_short
                     ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT17(in_stack_fffffffffffffff7.m_int,
                               CONCAT16(in_stack_fffffffffffffff6.m_int,
                                        CONCAT15(in_stack_fffffffffffffff5.m_int,
                                                 CONCAT14(in_stack_fffffffffffffff4.m_int,
                                                          CONCAT13(in_stack_fffffffffffffff3.m_int,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffff2.m_int,
                                                  CONCAT11(in_stack_fffffffffffffff1.m_int,
                                                           in_stack_fffffffffffffff0.m_int))))))));
      __cxa_guard_release(&ConstCastTestT<signed_char>()::s);
    }
  }
  if (ConstCastTestT<signed_char>()::us == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::us);
    if (iVar2 != 0) {
      ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::us =
           ::SafeInt::operator_cast_to_unsigned_short
                     ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT17(in_stack_fffffffffffffff7.m_int,
                               CONCAT16(in_stack_fffffffffffffff6.m_int,
                                        CONCAT15(in_stack_fffffffffffffff5.m_int,
                                                 CONCAT14(in_stack_fffffffffffffff4.m_int,
                                                          CONCAT13(in_stack_fffffffffffffff3.m_int,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffff2.m_int,
                                                  CONCAT11(in_stack_fffffffffffffff1.m_int,
                                                           in_stack_fffffffffffffff0.m_int))))))));
      __cxa_guard_release(&ConstCastTestT<signed_char>()::us);
    }
  }
  if (ConstCastTestT<signed_char>()::i == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::i);
    if (iVar2 != 0) {
      ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::i =
           ::SafeInt::operator_cast_to_int
                     ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT17(in_stack_fffffffffffffff7.m_int,
                               CONCAT16(in_stack_fffffffffffffff6.m_int,
                                        CONCAT15(in_stack_fffffffffffffff5.m_int,
                                                 CONCAT14(in_stack_fffffffffffffff4.m_int,
                                                          CONCAT13(in_stack_fffffffffffffff3.m_int,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffff2.m_int,
                                                  CONCAT11(in_stack_fffffffffffffff1.m_int,
                                                           in_stack_fffffffffffffff0.m_int))))))));
      __cxa_guard_release(&ConstCastTestT<signed_char>()::i);
    }
  }
  if (ConstCastTestT<signed_char>()::ui == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::ui);
    if (iVar2 != 0) {
      in_stack_fffffffffffffff7 = ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::ui =
           ::SafeInt::operator_cast_to_unsigned_int
                     ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT17(in_stack_fffffffffffffff7.m_int,
                               CONCAT16(in_stack_fffffffffffffff6.m_int,
                                        CONCAT15(in_stack_fffffffffffffff5.m_int,
                                                 CONCAT14(in_stack_fffffffffffffff4.m_int,
                                                          CONCAT13(in_stack_fffffffffffffff3.m_int,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffff2.m_int,
                                                  CONCAT11(in_stack_fffffffffffffff1.m_int,
                                                           in_stack_fffffffffffffff0.m_int))))))));
      __cxa_guard_release(&ConstCastTestT<signed_char>()::ui);
    }
  }
  if (ConstCastTestT<signed_char>()::l == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::l);
    if (iVar2 != 0) {
      in_stack_fffffffffffffff6 = ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::l =
           ::SafeInt::operator_cast_to_long
                     ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT17(in_stack_fffffffffffffff7.m_int,
                               CONCAT16(in_stack_fffffffffffffff6.m_int,
                                        CONCAT15(in_stack_fffffffffffffff5.m_int,
                                                 CONCAT14(in_stack_fffffffffffffff4.m_int,
                                                          CONCAT13(in_stack_fffffffffffffff3.m_int,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffff2.m_int,
                                                  CONCAT11(in_stack_fffffffffffffff1.m_int,
                                                           in_stack_fffffffffffffff0.m_int))))))));
      __cxa_guard_release(&ConstCastTestT<signed_char>()::l);
    }
  }
  if (ConstCastTestT<signed_char>()::ul == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::ul);
    if (iVar2 != 0) {
      in_stack_fffffffffffffff5 = ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::ul =
           ::SafeInt::operator_cast_to_unsigned_long
                     ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT17(in_stack_fffffffffffffff7.m_int,
                               CONCAT16(in_stack_fffffffffffffff6.m_int,
                                        CONCAT15(in_stack_fffffffffffffff5.m_int,
                                                 CONCAT14(in_stack_fffffffffffffff4.m_int,
                                                          CONCAT13(in_stack_fffffffffffffff3.m_int,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffff2.m_int,
                                                  CONCAT11(in_stack_fffffffffffffff1.m_int,
                                                           in_stack_fffffffffffffff0.m_int))))))));
      __cxa_guard_release(&ConstCastTestT<signed_char>()::ul);
    }
  }
  if (ConstCastTestT<signed_char>()::ll == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::ll);
    if (iVar2 != 0) {
      in_stack_fffffffffffffff4 = ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::ll =
           ::SafeInt::operator_cast_to_long_long
                     ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT17(in_stack_fffffffffffffff7.m_int,
                               CONCAT16(in_stack_fffffffffffffff6.m_int,
                                        CONCAT15(in_stack_fffffffffffffff5.m_int,
                                                 CONCAT14(in_stack_fffffffffffffff4.m_int,
                                                          CONCAT13(in_stack_fffffffffffffff3.m_int,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffff2.m_int,
                                                  CONCAT11(in_stack_fffffffffffffff1.m_int,
                                                           in_stack_fffffffffffffff0.m_int))))))));
      __cxa_guard_release(&ConstCastTestT<signed_char>()::ll);
    }
  }
  if (ConstCastTestT<signed_char>()::ull == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::ull);
    if (iVar2 != 0) {
      in_stack_fffffffffffffff3 = ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::ull =
           ::SafeInt::operator_cast_to_unsigned_long_long
                     ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT17(in_stack_fffffffffffffff7.m_int,
                               CONCAT16(in_stack_fffffffffffffff6.m_int,
                                        CONCAT15(in_stack_fffffffffffffff5.m_int,
                                                 CONCAT14(in_stack_fffffffffffffff4.m_int,
                                                          CONCAT13(in_stack_fffffffffffffff3.m_int,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffff2.m_int,
                                                  CONCAT11(in_stack_fffffffffffffff1.m_int,
                                                           in_stack_fffffffffffffff0.m_int))))))));
      __cxa_guard_release(&ConstCastTestT<signed_char>()::ull);
    }
  }
  if (ConstCastTestT<signed_char>()::st == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::st);
    if (iVar2 != 0) {
      in_stack_fffffffffffffff2 = ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::st =
           ::SafeInt::operator_cast_to_unsigned_long
                     ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT17(in_stack_fffffffffffffff7.m_int,
                               CONCAT16(in_stack_fffffffffffffff6.m_int,
                                        CONCAT15(in_stack_fffffffffffffff5.m_int,
                                                 CONCAT14(in_stack_fffffffffffffff4.m_int,
                                                          CONCAT13(in_stack_fffffffffffffff3.m_int,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffff2.m_int,
                                                  CONCAT11(in_stack_fffffffffffffff1.m_int,
                                                           in_stack_fffffffffffffff0.m_int))))))));
      __cxa_guard_release(&ConstCastTestT<signed_char>()::st);
    }
  }
  if (ConstCastTestT<signed_char>()::pt == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::pt);
    if (iVar2 != 0) {
      in_stack_fffffffffffffff1 = ConstSafeInt<signed_char>();
      ConstCastTestT<signed_char>::pt =
           ::SafeInt::operator_cast_to_long
                     ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT17(in_stack_fffffffffffffff7.m_int,
                               CONCAT16(in_stack_fffffffffffffff6.m_int,
                                        CONCAT15(in_stack_fffffffffffffff5.m_int,
                                                 CONCAT14(in_stack_fffffffffffffff4.m_int,
                                                          CONCAT13(in_stack_fffffffffffffff3.m_int,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffff2.m_int,
                                                  CONCAT11(in_stack_fffffffffffffff1.m_int,
                                                           in_stack_fffffffffffffff0.m_int))))))));
      __cxa_guard_release(&ConstCastTestT<signed_char>()::pt);
    }
  }
  if (ConstCastTestT<signed_char>()::pl == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<signed_char>()::pl);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<signed_char>();
      SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
                ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &stack0xfffffffffffffff0);
      ConstCastTestT<signed_char>::pl =
           ::SafeInt::operator_cast_to_int
                     ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                      CONCAT17(in_stack_fffffffffffffff7.m_int,
                               CONCAT16(in_stack_fffffffffffffff6.m_int,
                                        CONCAT15(in_stack_fffffffffffffff5.m_int,
                                                 CONCAT14(in_stack_fffffffffffffff4.m_int,
                                                          CONCAT13(in_stack_fffffffffffffff3.m_int,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffff2.m_int,
                                                  CONCAT11(in_stack_fffffffffffffff1.m_int,
                                                           SVar1.m_int))))))));
      __cxa_guard_release(&ConstCastTestT<signed_char>()::pl);
    }
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}